

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool CoreML::hasWeightOfType(Model *model,WeightParamType *wt)

{
  uint32 uVar1;
  bool bVar2;
  Type *layer;
  int index;
  RepeatedPtrFieldBase *this;
  
  uVar1 = model->_oneof_case_[0];
  if (((uVar1 == 0x12f) || (uVar1 == 0x193)) || (uVar1 == 500)) {
    this = &(((model->Type_).pipeline_)->models_).super_RepeatedPtrFieldBase;
  }
  else {
    this = (RepeatedPtrFieldBase *)0x0;
  }
  if ((this == (RepeatedPtrFieldBase *)0x0) || (index = 0, this->current_size_ < 1)) {
    bVar2 = false;
  }
  else {
    do {
      layer = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (this,index);
      bVar2 = hasWeightOfType(layer,wt);
      if (bVar2) {
        return bVar2;
      }
      index = index + 1;
    } while (index < this->current_size_);
  }
  return bVar2;
}

Assistant:

bool CoreML::hasWeightOfType(const Specification::Model& model, const WeightParamType& wt) {
    auto layers = getNNSpec(model);
    if(layers) {
        for(int i =0; i< layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            if(hasWeightOfType(layer,wt)) {
                return true;
            }
        }
    }
    return false;
}